

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetStopTime(void *arkode_mem,realtype tstop)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetStopTime","arkode_mem = NULL illegal.");
  }
  else {
    if ((0 < *(long *)((long)arkode_mem + 0x1d8)) &&
       ((tstop - *(double *)((long)arkode_mem + 0x198)) * *(double *)((long)arkode_mem + 0x168) <
        0.0)) {
      arkProcessError((ARKodeMem)arkode_mem,-0x16,"ARKode","arkSetStopTime",
                      "The value tstop = %lg is behind current t = %lg in the direction of integration."
                     );
      return -0x16;
    }
    *(realtype *)((long)arkode_mem + 0x158) = tstop;
    *(undefined4 *)((long)arkode_mem + 0x150) = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkSetStopTime(void *arkode_mem, realtype tstop)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetStopTime", MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* If ARKode was called at least once, test if tstop is legal
     (i.e. if it was not already passed).
     If arkSetStopTime is called before the first call to ARKode,
     tstop will be checked in ARKode. */
  if (ark_mem->nst > 0) {
    if ( (tstop - ark_mem->tcur) * ark_mem->h < ZERO ) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                      "arkSetStopTime", MSG_ARK_BAD_TSTOP,
                      tstop, ark_mem->tcur);
      return(ARK_ILL_INPUT);
    }
  }

  ark_mem->tstop    = tstop;
  ark_mem->tstopset = SUNTRUE;

  return(ARK_SUCCESS);
}